

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkvstore_test.cc
# Opt level: O0

int test_delete_instance(void)

{
  code *pcVar1;
  char *__s;
  RkvstoreDeleteInstanceRequestType *pRVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_191;
  int ret;
  HttpTestListener *local_170;
  HttpTestListener *listener;
  string local_160;
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [55];
  allocator<char> local_d9;
  string local_d8 [32];
  RkvstoreDeleteInstanceRequestType *local_b8;
  Rkvstore *rkvstore;
  undefined1 local_a8 [7];
  RkvstoreDeleteInstanceResponseType resp;
  RkvstoreDeleteInstanceRequestType req;
  
  aliyun::RkvstoreDeleteInstanceRequestType::RkvstoreDeleteInstanceRequestType
            ((RkvstoreDeleteInstanceRequestType *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"cn-hangzhou",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"my_appid",&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"my_secret",&local_139);
  pRVar2 = (RkvstoreDeleteInstanceRequestType *)
           aliyun::Rkvstore::CreateRkvstoreClient(local_d8,local_110,local_138);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  local_b8 = pRVar2;
  if (pRVar2 == (RkvstoreDeleteInstanceRequestType *)0x0) {
    aliyun::RkvstoreDeleteInstanceRequestType::~RkvstoreDeleteInstanceRequestType
              ((RkvstoreDeleteInstanceRequestType *)local_a8);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Rkvstore::SetProxyHost((Rkvstore *)pRVar2,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Rkvstore::SetUseTls((Rkvstore *)local_b8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_delete_instance_response;
  local_170 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_191);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_191);
  HttpTestListener::Start(local_170);
  std::__cxx11::string::operator=((string *)local_a8,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.owner_account.field_2._M_local_buf + 8),"InstanceId");
  aliyun::Rkvstore::DeleteInstance
            (local_b8,(RkvstoreDeleteInstanceResponseType *)local_a8,
             (RkvstoreErrorInfo *)((long)&rkvstore + 7));
  HttpTestListener::WaitComplete(local_170);
  pHVar3 = local_170;
  if (local_170 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_170);
    operator_delete(pHVar3,0x180);
  }
  pRVar2 = local_b8;
  if (local_b8 != (RkvstoreDeleteInstanceRequestType *)0x0) {
    aliyun::Rkvstore::~Rkvstore((Rkvstore *)local_b8);
    operator_delete(pRVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_delete_instance() {
  RkvstoreDeleteInstanceRequestType req;
  RkvstoreDeleteInstanceResponseType resp;
  Rkvstore* rkvstore = Rkvstore::CreateRkvstoreClient("cn-hangzhou", "my_appid", "my_secret");
  if(!rkvstore) return 0;
  rkvstore->SetProxyHost("127.0.0.1:12234");
  rkvstore->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_delete_instance_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  req.instance_id = "InstanceId";
  int ret = rkvstore->DeleteInstance(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete rkvstore;
}